

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O1

size_t __thiscall
duckdb_moodycamel::
ConcurrentQueue<duckdb::BufferEvictionNode,duckdb_moodycamel::ConcurrentQueueDefaultTraits>::
ExplicitProducer::
dequeue_bulk<__gnu_cxx::__normal_iterator<duckdb::BufferEvictionNode*,std::vector<duckdb::BufferEvictionNode,std::allocator<duckdb::BufferEvictionNode>>>>
          (ExplicitProducer *this,
          __normal_iterator<duckdb::BufferEvictionNode_*,_std::vector<duckdb::BufferEvictionNode,_std::allocator<duckdb::BufferEvictionNode>_>_>
          *itemFirst,size_t max)

{
  ExplicitProducer *pEVar1;
  _Atomic_word *p_Var2;
  ulong uVar3;
  BufferEvictionNode *pBVar4;
  long *plVar5;
  BufferEvictionNode *pBVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  
  uVar10 = (*(long *)(this + 0x38) - *(long *)(this + 0x30)) + *(long *)(this + 0x20);
  if (0 < (long)uVar10) {
    if (uVar10 < max) {
      max = uVar10;
    }
    LOCK();
    pEVar1 = this + 0x30;
    sVar12 = *(size_t *)pEVar1;
    *(size_t *)pEVar1 = *(size_t *)pEVar1 + max;
    UNLOCK();
    uVar10 = (*(long *)(this + 0x38) - sVar12) + *(long *)(this + 0x20);
    if ((long)uVar10 < 1) {
      LOCK();
      *(size_t *)(this + 0x38) = *(long *)(this + 0x38) + max;
      UNLOCK();
    }
    else {
      sVar12 = uVar10;
      if (max < uVar10) {
        sVar12 = max;
      }
      if (uVar10 < max) {
        LOCK();
        *(size_t *)(this + 0x38) = *(long *)(this + 0x38) + (max - sVar12);
        UNLOCK();
      }
      LOCK();
      pEVar1 = this + 0x28;
      uVar11 = *(ulong *)pEVar1;
      *(ulong *)pEVar1 = *(ulong *)pEVar1 + sVar12;
      UNLOCK();
      plVar5 = *(long **)(this + 0x58);
      lVar15 = (uVar11 & 0xffffffffffffffe0) - *(long *)(plVar5[2] + plVar5[1] * 0x10);
      lVar13 = lVar15 + 0x1f;
      if (-1 < lVar15) {
        lVar13 = lVar15;
      }
      uVar16 = *plVar5 - 1U & (lVar13 >> 5) + plVar5[1];
      uVar3 = uVar11 + sVar12;
      do {
        uVar14 = (uVar11 & 0xffffffffffffffe0) + 0x20;
        if (0x8000000000000000 < uVar3 - uVar14) {
          uVar14 = uVar3;
        }
        lVar13 = *(long *)(plVar5[2] + 8 + uVar16 * 0x10);
        uVar8 = uVar11;
        for (uVar17 = uVar11; uVar17 != uVar14; uVar17 = uVar17 + 1) {
          pBVar4 = (BufferEvictionNode *)(lVar13 + (ulong)((uint)uVar17 & 0x1f) * 0x18);
          pBVar6 = itemFirst->_M_current;
          if (pBVar6 != pBVar4) {
            (pBVar6->handle).internal.
            super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (pBVar4->handle).internal.
                 super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&(pBVar6->handle).internal.
                        super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,
                       &(pBVar4->handle).internal.
                        super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          pBVar6->handle_sequence_number = pBVar4->handle_sequence_number;
          itemFirst->_M_current = itemFirst->_M_current + 1;
          p_Var7 = (pBVar4->handle).internal.
                   super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var2 = &p_Var7->_M_weak_count;
              iVar9 = *p_Var2;
              *p_Var2 = *p_Var2 + -1;
              UNLOCK();
            }
            else {
              iVar9 = p_Var7->_M_weak_count;
              p_Var7->_M_weak_count = iVar9 + -1;
            }
            if (iVar9 == 1) {
              (*p_Var7->_vptr__Sp_counted_base[3])();
            }
          }
          uVar8 = uVar14;
        }
        lVar15 = uVar11 - uVar14;
        if (lVar15 != 0) {
          do {
            *(undefined1 *)((lVar13 - (ulong)((uint)uVar11 & 0x1f)) + 0x330 + lVar15) = 1;
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0);
        }
        uVar16 = uVar16 + 1 & *plVar5 - 1U;
        uVar11 = uVar8;
      } while (uVar8 != uVar3);
    }
    if (0 < (long)uVar10) {
      return sVar12;
    }
  }
  return 0;
}

Assistant:

size_t dequeue_bulk(It& itemFirst, size_t max)
		{
			auto tail = this->tailIndex.load(std::memory_order_relaxed);
			auto overcommit = this->dequeueOvercommit.load(std::memory_order_relaxed);
			auto desiredCount = static_cast<size_t>(tail - (this->dequeueOptimisticCount.load(std::memory_order_relaxed) - overcommit));
			if (details::circular_less_than<size_t>(0, desiredCount)) {
				desiredCount = desiredCount < max ? desiredCount : max;
				std::atomic_thread_fence(std::memory_order_acquire);
				
				auto myDequeueCount = this->dequeueOptimisticCount.fetch_add(desiredCount, std::memory_order_relaxed);;
				
				tail = this->tailIndex.load(std::memory_order_acquire);
				auto actualCount = static_cast<size_t>(tail - (myDequeueCount - overcommit));
				if (details::circular_less_than<size_t>(0, actualCount)) {
					actualCount = desiredCount < actualCount ? desiredCount : actualCount;
					if (actualCount < desiredCount) {
						this->dequeueOvercommit.fetch_add(desiredCount - actualCount, std::memory_order_release);
					}
					
					// Get the first index. Note that since there's guaranteed to be at least actualCount elements, this
					// will never exceed tail.
					auto firstIndex = this->headIndex.fetch_add(actualCount, std::memory_order_acq_rel);
					
					// Determine which block the first element is in
					auto localBlockIndex = blockIndex.load(std::memory_order_acquire);
					auto localBlockIndexHead = localBlockIndex->front.load(std::memory_order_acquire);
					
					auto headBase = localBlockIndex->entries[localBlockIndexHead].base;
					auto firstBlockBaseIndex = firstIndex & ~static_cast<index_t>(BLOCK_SIZE - 1);
					auto offset = static_cast<size_t>(static_cast<typename std::make_signed<index_t>::type>(firstBlockBaseIndex - headBase) / static_cast<typename std::make_signed<index_t>::type>(BLOCK_SIZE));
					auto indexIndex = (localBlockIndexHead + offset) & (localBlockIndex->size - 1);
					
					// Iterate the blocks and dequeue
					auto index = firstIndex;
					do {
						auto firstIndexInBlock = index;
						auto endIndex = (index & ~static_cast<index_t>(BLOCK_SIZE - 1)) + static_cast<index_t>(BLOCK_SIZE);
						endIndex = details::circular_less_than<index_t>(firstIndex + static_cast<index_t>(actualCount), endIndex) ? firstIndex + static_cast<index_t>(actualCount) : endIndex;
						auto block = localBlockIndex->entries[indexIndex].block;
						if (MOODYCAMEL_NOEXCEPT_ASSIGN(T, T&&, details::deref_noexcept(itemFirst) = std::move((*(*block)[index])))) {
							while (index != endIndex) {
								auto& el = *((*block)[index]);
								*itemFirst++ = std::move(el);
								el.~T();
								++index;
							}
						}
						else {
							MOODYCAMEL_TRY {
								while (index != endIndex) {
									auto& el = *((*block)[index]);
									*itemFirst = std::move(el);
									++itemFirst;
									el.~T();
									++index;
								}
							}
							MOODYCAMEL_CATCH (...) {
								// It's too late to revert the dequeue, but we can make sure that all
								// the dequeued objects are properly destroyed and the block index
								// (and empty count) are properly updated before we propagate the exception
								do {
									block = localBlockIndex->entries[indexIndex].block;
									while (index != endIndex) {
										(*block)[index++]->~T();
									}
									block->ConcurrentQueue::Block::template set_many_empty<explicit_context>(firstIndexInBlock, static_cast<size_t>(endIndex - firstIndexInBlock));
									indexIndex = (indexIndex + 1) & (localBlockIndex->size - 1);
									
									firstIndexInBlock = index;
									endIndex = (index & ~static_cast<index_t>(BLOCK_SIZE - 1)) + static_cast<index_t>(BLOCK_SIZE);
									endIndex = details::circular_less_than<index_t>(firstIndex + static_cast<index_t>(actualCount), endIndex) ? firstIndex + static_cast<index_t>(actualCount) : endIndex;
								} while (index != firstIndex + actualCount);
								
								MOODYCAMEL_RETHROW;
							}
						}
						block->ConcurrentQueue::Block::template set_many_empty<explicit_context>(firstIndexInBlock, static_cast<size_t>(endIndex - firstIndexInBlock));
						indexIndex = (indexIndex + 1) & (localBlockIndex->size - 1);
					} while (index != firstIndex + actualCount);
					
					return actualCount;
				}
				else {
					// Wasn't anything to dequeue after all; make the effective dequeue count eventually consistent
					this->dequeueOvercommit.fetch_add(desiredCount, std::memory_order_release);
				}
			}
			
			return 0;
		}